

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O1

JsErrorCode JsPrivateSetProperty(JsValueRef object,JsValueRef key,JsValueRef value)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  JsErrorCode JVar4;
  BOOL BVar5;
  JsrtContext *currentContext;
  RecyclableObject *pRVar6;
  DynamicObject *this;
  JavascriptArray *objArray;
  undefined4 *puVar7;
  ScriptContext *__localScriptContext;
  anon_union_8_2_815e7e51_for_DynamicObject_2 instance;
  void *unaff_retaddr;
  undefined1 auStack_a8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  EnterScriptObject __enterScriptObject;
  TTDRecorder _actionEntryPopper;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  __enterScriptObject.library = (JavascriptLibrary *)0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  currentContext = JsrtContext::GetCurrent();
  JVar4 = CheckContext(currentContext,false,false);
  if (JVar4 != JsNoError) goto LAB_003c95ec;
  scriptContext =
       (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&_actionEntryPopper.m_resultPtr + 4),
             ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
  __entryExitRecord.scriptContext = (ScriptContext *)0x0;
  __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
  __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
  auStack_a8 = (undefined1  [8])0x0;
  __entryExitRecord._0_1_ = 0;
  __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
  __entryExitRecord._2_6_ = 0;
  __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType,scriptContext,
             (ScriptEntryExitRecord *)auStack_a8,unaff_retaddr,&stack0x00000000,true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    TTD::EventLog::RecordJsRTSetIndex
              (scriptContext->threadContext->TTDLog,
               (TTDJsRTActionResultAutoRecorder *)&__enterScriptObject.library,object,key,value);
  }
  if (object == (JsValueRef)0x0) {
LAB_003c9543:
    JVar4 = JsErrorInvalidArgument;
  }
  else {
    BVar5 = Js::JavascriptOperators::IsObject(object);
    if (BVar5 == 0) {
      JVar4 = JsErrorArgumentNotObject;
    }
    else {
      pRVar6 = Js::VarTo<Js::RecyclableObject>(object);
      pSVar1 = (((((pRVar6->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        JVar4 = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_003c9566;
        object = Js::CrossSite::MarshalVar(scriptContext,pRVar6,false);
      }
      if (key == (JsValueRef)0x0) goto LAB_003c9543;
      if ((ulong)key >> 0x30 == 0) {
        pRVar6 = Js::VarTo<Js::RecyclableObject>(key);
        pSVar1 = (((((pRVar6->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                 scriptContext.ptr;
        if (pSVar1 != scriptContext) {
          JVar4 = JsErrorWrongRuntime;
          if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_003c9566;
          key = Js::CrossSite::MarshalVar(scriptContext,pRVar6,false);
        }
      }
      JVar4 = JsErrorInvalidArgument;
      if (value != (JsValueRef)0x0) {
        if (value < &DAT_1000000000000) {
          pRVar6 = Js::VarTo<Js::RecyclableObject>(value);
          pSVar1 = (((((pRVar6->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                   scriptContext.ptr;
          if (pSVar1 != scriptContext) {
            JVar4 = JsErrorWrongRuntime;
            if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_003c9566;
            value = Js::CrossSite::MarshalVar(scriptContext,pRVar6,false);
          }
        }
        this = Js::VarTo<Js::DynamicObject>(object);
        bVar3 = Js::DynamicObject::HasObjectArray(this);
        if (!bVar3) {
          objArray = Js::JavascriptLibrary::CreateArray
                               ((scriptContext->super_ScriptContextBase).javascriptLibrary);
          Js::DynamicObject::SetObjectArray(this,&objArray->super_ArrayObject);
        }
        bVar3 = Js::DynamicObject::HasObjectArray(this);
        JVar4 = JsNoError;
        if (bVar3) {
          instance = this->field_1;
        }
        else {
          instance = (anon_union_8_2_815e7e51_for_DynamicObject_2)0x0;
        }
        Js::JavascriptOperators::OP_SetElementI
                  ((Var)instance,key,value,scriptContext,PropertyOperation_None);
      }
    }
  }
LAB_003c9566:
  Js::EnterScriptObject::~EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  if (((JVar4 - JsErrorNoCurrentContext < 7) &&
      ((0x43U >> (JVar4 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) || (JVar4 == JsErrorFatal)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/../JsrtInternal.h"
                       ,0xcc,
                       "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                       ,
                       "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&_actionEntryPopper.m_resultPtr + 4));
LAB_003c95ec:
  if (__enterScriptObject.library != (JavascriptLibrary *)0x0) {
    if (*(int *)((long)&((__enterScriptObject.library)->super_JavascriptLibraryBase).
                        super_FinalizableObject.super_IRecyclerVisitedObject.
                        _vptr_IRecyclerVisitedObject + 4) != -1) {
      TTDAbort_unrecoverable_error("Hmm this got changed somewhere???");
    }
    *(JsErrorCode *)
     ((long)&((__enterScriptObject.library)->super_JavascriptLibraryBase).super_FinalizableObject.
             super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 4) = JVar4;
  }
  return JVar4;
}

Assistant:

CHAKRA_API JsPrivateSetProperty(
    _In_ JsValueRef object,
    _In_ JsValueRef key,
    _In_ JsValueRef value)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTSetIndex, object, key, value);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_REFERENCE(key, scriptContext);
        VALIDATE_INCOMING_REFERENCE(value, scriptContext);

        Js::DynamicObject* dynObj = Js::VarTo<Js::DynamicObject>(object);

        if (!dynObj->HasObjectArray())
        {
            Js::ArrayObject* objArray = scriptContext->GetLibrary()->CreateArray();
            dynObj->SetObjectArray(objArray);
        }
        Js::JavascriptOperators::OP_SetElementI(dynObj->GetObjectArray(), key, value, scriptContext);

        return JsNoError;
    });
}